

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked.h
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 utf8::append<std::back_insert_iterator<std::__cxx11::string>>
           (uint32_t cp,
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           result)

{
  undefined8 *puVar1;
  char cVar2;
  
  if ((cp < 0x110000) && ((cp & 0xfffff800) != 0xd800)) {
    cVar2 = (char)result.container;
    if (0x7f < cp) {
      if (0x7ff < cp) {
        if (0xffff < cp) {
          std::__cxx11::string::push_back(cVar2);
        }
        std::__cxx11::string::push_back(cVar2);
      }
      std::__cxx11::string::push_back(cVar2);
    }
    std::__cxx11::string::push_back(cVar2);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )result.container;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar1 = &PTR__exception_00111c30;
  *(uint32_t *)(puVar1 + 1) = cp;
  __cxa_throw(puVar1,&invalid_code_point::typeinfo,std::exception::~exception);
}

Assistant:

octet_iterator append(uint32_t cp, octet_iterator result)
    {
        if (!utf8::internal::is_code_point_valid(cp))
            throw invalid_code_point(cp);

        if (cp < 0x80)                        // one octet
            *(result++) = static_cast<uint8_t>(cp);
        else if (cp < 0x800) {                // two octets
            *(result++) = static_cast<uint8_t>((cp >> 6)            | 0xc0);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else if (cp < 0x10000) {              // three octets
            *(result++) = static_cast<uint8_t>((cp >> 12)           | 0xe0);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        else {                                // four octets
            *(result++) = static_cast<uint8_t>((cp >> 18)           | 0xf0);
            *(result++) = static_cast<uint8_t>(((cp >> 12) & 0x3f)  | 0x80);
            *(result++) = static_cast<uint8_t>(((cp >> 6) & 0x3f)   | 0x80);
            *(result++) = static_cast<uint8_t>((cp & 0x3f)          | 0x80);
        }
        return result;
    }